

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(WordTagger *this,WordTagger *from)

{
  void *pvVar1;
  ArenaStringPtr AVar2;
  LogMessage *other;
  StringVector *this_00;
  StringVector *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/WordTagger.pb.cc"
               ,0x20a);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  AVar2.ptr_ = (from->language_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->language_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->tokensoutputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokensoutputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->tokentagsoutputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokentagsoutputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->tokenlocationsoutputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokenlocationsoutputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->tokenlengthsoutputfeaturename_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->tokenlengthsoutputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  AVar2.ptr_ = (from->modelparameterdata_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->modelparameterdata_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  if (from->revision_ != 0) {
    this->revision_ = from->revision_;
  }
  if (from->_oneof_case_[0] == 200) {
    this_00 = mutable_stringtags(this);
    from_00 = stringtags(from);
    StringVector::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

void WordTagger::MergeFrom(const WordTagger& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CoreMLModels.WordTagger)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.language().size() > 0) {

    language_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.language_);
  }
  if (from.tokensoutputfeaturename().size() > 0) {

    tokensoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokensoutputfeaturename_);
  }
  if (from.tokentagsoutputfeaturename().size() > 0) {

    tokentagsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokentagsoutputfeaturename_);
  }
  if (from.tokenlocationsoutputfeaturename().size() > 0) {

    tokenlocationsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlocationsoutputfeaturename_);
  }
  if (from.tokenlengthsoutputfeaturename().size() > 0) {

    tokenlengthsoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.tokenlengthsoutputfeaturename_);
  }
  if (from.modelparameterdata().size() > 0) {

    modelparameterdata_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.modelparameterdata_);
  }
  if (from.revision() != 0) {
    set_revision(from.revision());
  }
  switch (from.Tags_case()) {
    case kStringTags: {
      mutable_stringtags()->::CoreML::Specification::StringVector::MergeFrom(from.stringtags());
      break;
    }
    case TAGS_NOT_SET: {
      break;
    }
  }
}